

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_uuencode.c
# Opt level: O0

int archive_filter_uuencode_close(archive_write_filter *f)

{
  int iVar1;
  int iVar2;
  archive *in_RDI;
  int ret2;
  int ret;
  private_uuencode *state;
  size_t in_stack_00000080;
  uchar *in_stack_00000088;
  archive_string *in_stack_00000090;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  char *buff;
  
  buff = (in_RDI->error_string).s;
  if (*(long *)(buff + 0x40) != 0) {
    uu_encode(in_stack_00000090,in_stack_00000088,in_stack_00000080);
  }
  archive_string_sprintf((archive_string *)(buff + 0x20),"`\nend\n");
  archive_write_set_bytes_in_last_block(in_RDI,(int)((ulong)buff >> 0x20));
  iVar1 = __archive_write_filter
                    ((archive_write_filter *)in_RDI,buff,
                     CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  iVar2 = __archive_write_close_filter
                    ((archive_write_filter *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  if (iVar2 < iVar1) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

static int
archive_filter_uuencode_close(struct archive_write_filter *f)
{
	struct private_uuencode *state = (struct private_uuencode *)f->data;
	int ret, ret2;

	/* Flush remaining bytes. */
	if (state->hold_len != 0)
		uu_encode(&state->encoded_buff, state->hold, state->hold_len);
	archive_string_sprintf(&state->encoded_buff, "`\nend\n");
	/* Write the last block */
	archive_write_set_bytes_in_last_block(f->archive, 1);
	ret = __archive_write_filter(f->next_filter,
	    state->encoded_buff.s, archive_strlen(&state->encoded_buff));
	ret2 = __archive_write_close_filter(f->next_filter);
	if (ret > ret2)
		ret = ret2;
	return (ret);
}